

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult *
Catch::clara::detail::
invokeLambda<std::__cxx11::string,Catch::makeCommandLineParser(Catch::ConfigData&)::__3>
          (anon_class_8_1_50637480_for_m_lambda *lambda,string *arg)

{
  bool bVar1;
  BasicResult<Catch::clara::detail::ParseResultType> *in_RDI;
  long in_FS_OFFSET;
  ParserResult result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  BasicResult<Catch::clara::detail::ParseResultType> *in_stack_ffffffffffffff60;
  BasicResult<Catch::clara::detail::ParseResultType> *this;
  string *source;
  BasicResult local_58 [48];
  string local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  source = &local_28;
  this = in_RDI;
  ::std::__cxx11::string::string((string *)source);
  convertInto(source,(string *)this);
  bVar1 = BasicResult::operator_cast_to_bool(local_58);
  if (bVar1) {
    LambdaInvoker<Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>>::
    invoke<Catch::makeCommandLineParser(Catch::ConfigData&)::__3,std::__cxx11::string>
              ((anon_class_8_1_50637480_for_m_lambda *)in_RDI,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff60);
  }
  else {
    BasicResult<Catch::clara::detail::ParseResultType>::BasicResult(this,in_RDI);
  }
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(in_stack_ffffffffffffff60);
  ::std::__cxx11::string::~string((string *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline auto invokeLambda( L const &lambda, std::string const &arg ) -> ParserResult {
        ArgType temp{};
        auto result = convertInto( arg, temp );
        return !result
           ? result
           : LambdaInvoker<typename UnaryLambdaTraits<L>::ReturnType>::invoke( lambda, temp );
    }